

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O0

PMTStreamInfo * streamByIndex(int index,PIDListMap *pidList)

{
  bool bVar1;
  int iVar2;
  reference __in;
  type *ptVar3;
  PMTStreamInfo *stream;
  type *si;
  type *pid;
  _Self local_38;
  const_iterator __end1;
  const_iterator __begin1;
  PIDListMap *__range1;
  PIDListMap *pidList_local;
  int index_local;
  
  __end1 = std::
           map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
           ::begin(pidList);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
       ::end(pidList);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&local_38);
    if (!bVar1) {
      return (PMTStreamInfo *)0x0;
    }
    __in = std::_Rb_tree_const_iterator<std::pair<const_int,_PMTStreamInfo>_>::operator*(&__end1);
    std::get<0ul,int_const,PMTStreamInfo>(__in);
    ptVar3 = std::get<1ul,int_const,PMTStreamInfo>(__in);
    iVar2 = AbstractStreamReader::getStreamIndex(ptVar3->m_codecReader);
    if (iVar2 == index) break;
    std::_Rb_tree_const_iterator<std::pair<const_int,_PMTStreamInfo>_>::operator++(&__end1);
  }
  return ptVar3;
}

Assistant:

const PMTStreamInfo* streamByIndex(const int index, const PIDListMap& pidList)
{
    for (const auto& [pid, si] : pidList)
    {
        const PMTStreamInfo& stream = si;
        if (stream.m_codecReader->getStreamIndex() == index)
            return &stream;
    }
    return nullptr;
}